

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>::fulfill
          (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this,int *value)

{
  ExceptionOr<int> local_1a8;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1a8.value.ptr.isSet = true;
    local_1a8.value.ptr.field_1.value = *value;
    ExceptionOr<int>::operator=(&this->result,&local_1a8);
    if (local_1a8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }